

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O0

int ffgpvui(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,unsigned_short nulval,
           unsigned_short *array,int *anynul,int *status)

{
  int iVar1;
  LONGLONG local_70;
  unsigned_short local_62;
  int local_60;
  unsigned_short nullvalue;
  int nullcheck;
  char cdummy;
  long row;
  unsigned_short *array_local;
  LONGLONG LStack_40;
  unsigned_short nulval_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  local_60 = 1;
  row = (long)array;
  array_local._6_2_ = nulval;
  LStack_40 = nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (firstelem_local < 1) {
      local_70 = 1;
    }
    else {
      local_70 = firstelem_local;
    }
    _nullcheck = local_70;
    ffgclui((fitsfile *)group_local,2,local_70,nelem_local,LStack_40,1,1,array_local._6_2_,
            (unsigned_short *)row,(char *)((long)&nullvalue + 1),anynul,status);
    fptr_local._4_4_ = *status;
  }
  else {
    local_62 = array_local._6_2_;
    fits_read_compressed_pixels
              ((fitsfile *)group_local,0x14,nelem_local,LStack_40,local_60,&local_62,(void *)row,
               (char *)0x0,anynul,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpvui( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
   unsigned short nulval,     /* I - value for undefined pixels              */
   unsigned short *array,     /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    char cdummy;
    int nullcheck = 1;
    unsigned short nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
         nullvalue = nulval;  /* set local variable */

        fits_read_compressed_pixels(fptr, TUSHORT, firstelem, nelem,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgclui(fptr, 2, row, firstelem, nelem, 1, 1, nulval,
               array, &cdummy, anynul, status);
    return(*status);
}